

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonArrayFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  undefined1 local_b0 [8];
  JsonString jx;
  int i;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  jsonInit((JsonString *)local_b0,ctx);
  jsonAppendChar((JsonString *)local_b0,'[');
  jx.zSpace[0x62] = '\0';
  jx.zSpace[99] = '\0';
  jx._134_2_ = 0;
  for (; (int)jx._132_4_ < argc; jx._132_4_ = jx._132_4_ + 1) {
    jsonAppendSeparator((JsonString *)local_b0);
    jsonAppendValue((JsonString *)local_b0,argv[(int)jx._132_4_]);
  }
  jsonAppendChar((JsonString *)local_b0,']');
  jsonResult((JsonString *)local_b0);
  sqlite3_result_subtype(ctx,0x4a);
  return;
}

Assistant:

static void jsonArrayFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  JsonString jx;

  jsonInit(&jx, ctx);
  jsonAppendChar(&jx, '[');
  for(i=0; i<argc; i++){
    jsonAppendSeparator(&jx);
    jsonAppendValue(&jx, argv[i]);
  }
  jsonAppendChar(&jx, ']');
  jsonResult(&jx);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}